

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long> * __thiscall
TPZFMatrix<long>::operator-=(TPZFMatrix<long> *this,TPZMatrix<long> *aBase)

{
  int64_t iVar1;
  int64_t iVar2;
  long in_RSI;
  TPZFMatrix<long> *in_RDI;
  int64_t i;
  long *pa;
  long *pm;
  int64_t size;
  TPZFMatrix<long> *A;
  char *in_stack_00000158;
  char *in_stack_00000160;
  TPZBaseMatrix *local_50;
  long local_38;
  _func_int **local_30;
  long *local_28;
  
  if (in_RSI == 0) {
    local_50 = (TPZBaseMatrix *)0x0;
  }
  else {
    local_50 = (TPZBaseMatrix *)__dynamic_cast(in_RSI,&TPZMatrix<long>::typeinfo,&typeinfo,0);
  }
  if (local_50 == (TPZBaseMatrix *)0x0) {
    Error(in_stack_00000160,in_stack_00000158);
  }
  iVar1 = TPZBaseMatrix::Rows(local_50);
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  if (iVar1 == iVar2) {
    iVar1 = TPZBaseMatrix::Cols(local_50);
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    if (iVar1 == iVar2) goto LAB_0120e725;
  }
  Error(in_stack_00000160,in_stack_00000158);
LAB_0120e725:
  iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  local_30 = local_50[1].super_TPZSavable._vptr_TPZSavable;
  local_28 = in_RDI->fElem;
  for (local_38 = 0; local_38 < iVar1 * iVar2; local_38 = local_38 + 1) {
    *local_28 = *local_28 - (long)*local_30;
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator-=(const TPZMatrix<TVar> &aBase ) {
    auto A = dynamic_cast<const TPZFMatrix<TVar>*>(&aBase);
    if(!A){
        Error(__PRETTY_FUNCTION__," incompatible argument");
    }
    if ( (A->Rows() != this->Rows())  ||  (A->Cols() != this->Cols()) )
        Error( "Operator-= <matrixs with different dimensions>" );
    
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * pm = fElem;
    TVar * pa = A->fElem;
    
    for ( int64_t i = 0; i < size; i++ ) *pm++ -= *pa++;
    
    return( *this );
}